

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

void handle_pp_include(Context_conflict1 *ctx)

{
  char cVar1;
  IncludeState *s;
  MOJOSHADER_includeOpen p_Var2;
  MOJOSHADER_malloc p_Var3;
  MOJOSHADER_includeClose p_Var4;
  MOJOSHADER_free p_Var5;
  void *pvVar6;
  long lVar7;
  Token TVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *__src;
  char *fname;
  ulong __n;
  MOJOSHADER_includeType MVar12;
  undefined8 auStack_60 [3];
  char acStack_48 [8];
  char *local_40;
  char *newdata;
  uint newbytes;
  
  s = ctx->include_stack;
  if (s->pushedback == 0) {
    auStack_60[2] = 0x12fa49;
    TVar8 = preprocessor_lexer(s);
  }
  else {
    s->pushedback = 0;
    TVar8 = s->tokenval;
  }
  if (TVar8 == 0x3c) {
    uVar10 = s->bytes_left;
    while (uVar10 != 0) {
      cVar1 = *s->source;
      if ((cVar1 != '\n') && (cVar1 != '\r')) {
        pcVar11 = s->source + 1;
        s->source = pcVar11;
        uVar10 = uVar10 - 1;
        s->bytes_left = uVar10;
        if (cVar1 == '>') {
          MVar12 = MOJOSHADER_INCLUDETYPE_SYSTEM;
          goto LAB_0012fa64;
        }
      }
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
    }
  }
  else if (TVar8 == TOKEN_STRING_LITERAL) {
    pcVar11 = s->source;
    MVar12 = MOJOSHADER_INCLUDETYPE_LOCAL;
LAB_0012fa64:
    __src = s->token + 1;
    s->token = __src;
    lVar7 = -(((long)pcVar11 - (long)__src & 0xffffffffU) + 0xf & 0xfffffffffffffff0);
    fname = acStack_48 + lVar7;
    __n = (ulong)((int)((long)pcVar11 - (long)__src) - 1);
    *(undefined8 *)((long)auStack_60 + lVar7 + 0x10) = 0x12fa94;
    memcpy(fname,__src,__n);
    fname[__n] = '\0';
    *(undefined8 *)((long)auStack_60 + lVar7 + 0x10) = 0x12faa2;
    iVar9 = require_newline(s);
    if (iVar9 != 0) {
      local_40 = (char *)0x0;
      newdata._4_4_ = 0;
      p_Var2 = ctx->open_callback;
      if ((p_Var2 != (MOJOSHADER_includeOpen)0x0) &&
         (ctx->close_callback != (MOJOSHADER_includeClose)0x0)) {
        pcVar11 = s->source_base;
        p_Var3 = ctx->malloc;
        pvVar6 = ctx->malloc_data;
        *(MOJOSHADER_free *)((long)auStack_60 + lVar7 + 8) = ctx->free;
        *(void **)((long)auStack_60 + lVar7 + 0x10) = pvVar6;
        *(undefined8 *)((long)auStack_60 + lVar7) = 0x12fb01;
        iVar9 = (*p_Var2)(MVar12,fname,pcVar11,&local_40,(uint *)((long)&newdata + 4),p_Var3,
                          *(MOJOSHADER_free *)((long)auStack_60 + lVar7 + 8),
                          *(void **)((long)auStack_60 + lVar7 + 0x10));
        uVar10 = newdata._4_4_;
        pcVar11 = local_40;
        if (iVar9 == 0) {
          *(undefined8 *)((long)auStack_60 + lVar7 + 0x10) = 0x12fbf2;
          failf(ctx,"%s","Include callback failed");
        }
        else {
          p_Var4 = ctx->close_callback;
          *(undefined8 *)((long)auStack_60 + lVar7 + 0x10) = 0x12fb2c;
          iVar9 = push_source(ctx,fname,pcVar11,uVar10,1,p_Var4);
          pcVar11 = local_40;
          if (iVar9 == 0) {
            if (ctx->out_of_memory == 0) {
              *(code **)((long)auStack_60 + lVar7 + 0x10) = handle_pp_line;
              __assert_fail("ctx->out_of_memory",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x33e,"void handle_pp_include(Context *)");
            }
            p_Var3 = ctx->malloc;
            p_Var5 = ctx->free;
            pvVar6 = ctx->malloc_data;
            p_Var4 = ctx->close_callback;
            *(undefined8 *)((long)auStack_60 + lVar7 + 0x10) = 0x12fb5d;
            (*p_Var4)(pcVar11,p_Var3,p_Var5,pvVar6);
          }
        }
        return;
      }
      pcVar11 = "Saw #include, but no include callbacks defined";
      goto LAB_0012fba7;
    }
  }
  pcVar11 = "Invalid #include directive";
LAB_0012fba7:
  failf(ctx,"%s",pcVar11);
  return;
}

Assistant:

static void handle_pp_include(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    Token token = lexer(state);
    MOJOSHADER_includeType incltype;
    char *filename = NULL;
    int bogus = 0;

    if (token == TOKEN_STRING_LITERAL)
        incltype = MOJOSHADER_INCLUDETYPE_LOCAL;
    else if (token == ((Token) '<'))
    {
        incltype = MOJOSHADER_INCLUDETYPE_SYSTEM;
        // can't use lexer, since every byte between the < > pair is
        //  considered part of the filename.  :/
        while (!bogus)
        {
            if ( !(bogus = (state->bytes_left == 0)) )
            {
                const char ch = *state->source;
                if ( !(bogus = ((ch == '\r') || (ch == '\n'))) )
                {
                    state->source++;
                    state->bytes_left--;

                    if (ch == '>')
                        break;
                } // if
            } // if
        } // while
    } // else if
    else
    {
        bogus = 1;
    } // else

    if (!bogus)
    {
        state->token++;  // skip '<' or '\"'...
        const unsigned int len = ((unsigned int) (state->source-state->token));
        filename = (char *) alloca(len);
        memcpy(filename, state->token, len-1);
        filename[len-1] = '\0';
        bogus = !require_newline(state);
    } // if

    if (bogus)
    {
        fail(ctx, "Invalid #include directive");
        return;
    } // else

    const char *newdata = NULL;
    unsigned int newbytes = 0;
    if ((ctx->open_callback == NULL) || (ctx->close_callback == NULL))
    {
        fail(ctx, "Saw #include, but no include callbacks defined");
        return;
    } // if

    if (!ctx->open_callback(incltype, filename, state->source_base,
                            &newdata, &newbytes, ctx->malloc,
                            ctx->free, ctx->malloc_data))
    {
        fail(ctx, "Include callback failed");  // !!! FIXME: better error
        return;
    } // if

    MOJOSHADER_includeClose callback = ctx->close_callback;
    if (!push_source(ctx, filename, newdata, newbytes, 1, callback))
    {
        assert(ctx->out_of_memory);
        ctx->close_callback(newdata, ctx->malloc, ctx->free, ctx->malloc_data);
    } // if
}